

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O1

bool tcu::isNearestMipmapLinearCompareResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               TexComparePrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,float cmpReference,
               float result)

{
  float fVar1;
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  CompareMode compareMode;
  int c;
  bool isFixedPoint;
  bool bVar2;
  CmpResultSet CVar3;
  CmpResultSet CVar4;
  int iVar5;
  int iVar6;
  int i;
  int j;
  uint uVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float cmpValue_;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float d1;
  float d0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  int local_a8;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  isFixedPoint = isFixedPointDepthTextureFormat(&level0->m_format);
  dim = (level0->m_size).m_data[0];
  dim_00 = (level0->m_size).m_data[1];
  dim_01 = (level1->m_size).m_data[0];
  dim_02 = (level1->m_size).m_data[1];
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_48,sampler->normalizedCoords,dim,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_50,sampler->normalizedCoords,dim_01,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,dim_00,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,dim_02,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar11 = floorf(local_48);
  fVar12 = floorf(local_44);
  fVar13 = floorf(local_50);
  fVar14 = floorf(local_4c);
  fVar15 = floorf(local_38);
  local_a8 = (int)fVar15;
  fVar15 = floorf(local_34);
  iVar9 = (int)fVar15;
  fVar15 = floorf(local_40);
  fVar16 = floorf(local_3c);
  bVar2 = local_a8 <= iVar9;
  if (local_a8 <= iVar9) {
    c = (int)fVar11;
    do {
      for (; c <= (int)fVar12; c = c + 1) {
        iVar5 = TexVerifierUtil::wrap(sampler->wrapS,c,dim);
        iVar6 = TexVerifierUtil::wrap(sampler->wrapT,local_a8,dim_00);
        cmpValue_ = lookupDepth(level0,sampler,iVar5,iVar6,coordZ);
        for (iVar5 = (int)fVar15; iVar5 <= (int)fVar16; iVar5 = iVar5 + 1) {
          for (iVar6 = (int)fVar13; iVar6 <= (int)fVar14; iVar6 = iVar6 + 1) {
            i = TexVerifierUtil::wrap(sampler->wrapS,iVar6,dim_01);
            j = TexVerifierUtil::wrap(sampler->wrapT,iVar5,dim_02);
            fVar17 = lookupDepth(level1,sampler,i,j,coordZ);
            compareMode = sampler->compare;
            CVar3 = execCompare(compareMode,cmpValue_,cmpReference,prec->referenceBits,isFixedPoint)
            ;
            CVar4 = execCompare(compareMode,fVar17,cmpReference,prec->referenceBits,isFixedPoint);
            fVar17 = fBounds->m_data[0];
            fVar1 = fBounds->m_data[1];
            fVar18 = TexVerifierUtil::computeFixedPointError(prec->pcfBits);
            fVar19 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
            uVar8 = 0;
            bVar10 = true;
            uVar7 = 0xffffffff;
            do {
              if ((uVar7 & ((ushort)CVar4 >> 7 & 2 | (ushort)CVar3 >> 8 & 1) |
                  uVar8 & ((ushort)CVar3 & 1) + ((ushort)CVar4 & 1) * 2) == 3) {
                fVar22 = 0.0;
                fVar20 = 0.0;
                if ((uVar8 & 1) != 0) {
                  fVar20 = 1.0;
                }
                if (1 < uVar8) {
                  fVar22 = 1.0;
                }
                fVar21 = fVar20 * (1.0 - fVar17) + fVar17 * fVar22;
                fVar20 = fVar20 * (1.0 - fVar1) + fVar22 * fVar1;
                if (((float)(~-(uint)(fVar21 <= fVar20) & (uint)fVar20 |
                            -(uint)(fVar21 <= fVar20) & (uint)fVar21) - (fVar19 + fVar18) <= result)
                   && (result <= (float)(~-(uint)(fVar20 <= fVar21) & (uint)fVar20 |
                                        (uint)fVar21 & -(uint)(fVar20 <= fVar21)) + fVar19 + fVar18)
                   ) break;
              }
              bVar10 = uVar8 < 3;
              uVar8 = uVar8 + 1;
              uVar7 = uVar7 - 1;
            } while (uVar8 != 4);
            if (bVar10) {
              if (iVar5 <= (int)fVar16) {
                return bVar2;
              }
              goto LAB_01a026dd;
            }
          }
        }
LAB_01a026dd:
      }
      local_a8 = local_a8 + 1;
      bVar2 = local_a8 <= iVar9;
      c = (int)fVar11;
    } while (local_a8 <= iVar9);
  }
  return bVar2;
}

Assistant:

static bool isNearestMipmapLinearCompareResultValid (const ConstPixelBufferAccess&	level0,
													 const ConstPixelBufferAccess&	level1,
													 const Sampler&					sampler,
													 const TexComparePrecision&		prec,
													 const Vec2&					coord,
													 const int						coordZ,
													 const Vec2&					fBounds,
													 const float					cmpReference,
													 const float					result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level0.getFormat());

	const int	w0					= level0.getWidth();
	const int	w1					= level1.getWidth();
	const int	h0					= level0.getHeight();
	const int	h1					= level1.getHeight();

	const Vec2	uBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	uBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2	vBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int	minI0				= deFloorFloatToInt32(uBounds0.x());
	const int	maxI0				= deFloorFloatToInt32(uBounds0.y());
	const int	minI1				= deFloorFloatToInt32(uBounds1.x());
	const int	maxI1				= deFloorFloatToInt32(uBounds1.y());
	const int	minJ0				= deFloorFloatToInt32(vBounds0.x());
	const int	maxJ0				= deFloorFloatToInt32(vBounds0.y());
	const int	minJ1				= deFloorFloatToInt32(vBounds1.x());
	const int	maxJ1				= deFloorFloatToInt32(vBounds1.y());

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			const float	depth0	= lookupDepth(level0, sampler, wrap(sampler.wrapS, i0, w0), wrap(sampler.wrapT, j0, h0), coordZ);

			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					const float	depth1	= lookupDepth(level1, sampler, wrap(sampler.wrapS, i1, w1), wrap(sampler.wrapT, j1, h1), coordZ);

					if (isLinearCompareValid(sampler.compare, prec, Vec2(depth0, depth1), fBounds, cmpReference, result, isFixedPointDepth))
						return true;
				}
			}
		}
	}

	return false;
}